

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode parseurl_and_replace(char *url,CURLU *u,uint flags)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  _Bool _Var5;
  bool bVar6;
  int iVar7;
  CURLcode CVar8;
  CURLUcode CVar9;
  int iVar10;
  CURLUcode CVar11;
  size_t sVar12;
  size_t sVar13;
  char *pcVar14;
  Curl_handler *pCVar15;
  char *pcVar16;
  size_t sVar17;
  byte *pbVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  size_t buflen;
  CURLU *pCVar22;
  char **optionsp;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  size_t sVar26;
  byte *first;
  byte bVar27;
  char local_160;
  char endbracket;
  CURLU *local_158;
  char *passwdp;
  int len;
  char *local_140;
  dynbuf enc;
  dynbuf host;
  CURLU tmpurl;
  char local_88 [32];
  char schemebuf [41];
  
  bVar27 = 0;
  tmpurl.query = (char *)0x0;
  tmpurl.fragment = (char *)0x0;
  tmpurl.port = (char *)0x0;
  tmpurl.path = (char *)0x0;
  tmpurl.host = (char *)0x0;
  tmpurl.zoneid = (char *)0x0;
  tmpurl.password = (char *)0x0;
  tmpurl.options = (char *)0x0;
  tmpurl.scheme = (char *)0x0;
  tmpurl.user = (char *)0x0;
  tmpurl.portnum = 0;
  Curl_dyn_init(&host,8000000);
  sVar12 = strlen(url);
  if (sVar12 < 0x7a1201) {
    sVar13 = Curl_is_absolute_url(url,schemebuf,buflen,(flags & 0x204) != 0);
    CVar11 = CURLUE_BAD_SCHEME;
    if (sVar13 != 0) {
      iVar7 = bcmp(schemebuf,"file",5);
      if (iVar7 == 0) {
        CVar11 = CURLUE_BAD_FILE_URL;
        if (6 < sVar12) {
          tmpurl.scheme = (*Curl_cstrdup)("file");
          if (tmpurl.scheme != (char *)0x0) {
            first = (byte *)(url + 5);
            if ((*first == 0x2f) && (url[6] == '/')) {
              first = (byte *)(url + 7);
              if ((url[7] != 0x2f) &&
                 (((0x19 < (byte)((url[7] & 0xdfU) + 0xbf) || ((url[8] != '|' && (url[8] != ':'))))
                  || ((cVar2 = url[9], cVar2 != '\0' && ((cVar2 != '/' && (cVar2 != '\\')))))))) {
                iVar7 = curl_strnequal((char *)first,"localhost/",10);
                if ((iVar7 == 0) &&
                   (iVar7 = curl_strnequal((char *)first,"127.0.0.1/",10), iVar7 == 0))
                goto LAB_00423229;
                first = (byte *)(url + 0x10);
              }
            }
            Curl_dyn_reset(&host);
            if (*first == 0x2f) {
              bVar4 = true;
              if (((byte)((first[1] & 0xdf) + 0xbf) < 0x1a) &&
                 ((first[2] == 0x7c || (first[2] == 0x3a)))) {
                bVar3 = first[3];
LAB_0042300e:
                bVar4 = true;
                if (((bVar3 == 0) || (bVar3 == 0x2f)) || (bVar3 == 0x5c)) goto LAB_00423229;
              }
            }
            else {
              bVar4 = true;
              if (((byte)((*first & 0xdf) + 0xbf) < 0x1a) &&
                 ((first[1] == 0x7c || (first[1] == 0x3a)))) {
                bVar3 = first[2];
                goto LAB_0042300e;
              }
            }
            goto LAB_00423028;
          }
          goto LAB_00423226;
        }
      }
      else {
        pcVar14 = url + sVar13;
        for (uVar25 = 0xfffffffc;
            ((pcVar14 = pcVar14 + 1, url = (char *)0x0, pcVar14 != (char *)0x0 &&
             (url = pcVar14, *pcVar14 == '/')) && (uVar25 + 4 < 4)); uVar25 = uVar25 + 1) {
        }
        pcVar14 = schemebuf;
        pCVar15 = Curl_builtin_scheme(pcVar14,0xffffffffffffffff);
        if (((flags & 8) == 0) && (pCVar15 == (Curl_handler *)0x0)) {
          CVar11 = CURLUE_UNSUPPORTED_SCHEME;
        }
        else if (uVar25 < 0xfffffffd) {
          CVar11 = CURLUE_BAD_SLASHES;
        }
        else {
          _Var5 = junkscan(pcVar14,flags);
          if (!_Var5) goto LAB_00422e0e;
        }
      }
      goto LAB_00423229;
    }
    if ((flags & 0x204) == 0) goto LAB_00423229;
    pcVar14 = (char *)0x0;
    if ((flags & 4) != 0) {
      pcVar14 = "https";
    }
LAB_00422e0e:
    CVar11 = CURLUE_OUT_OF_MEMORY;
    sVar26 = 0;
    while ((0x3f < (ulong)(byte)url[sVar26] ||
           ((0x8000800800000001U >> ((ulong)(byte)url[sVar26] & 0x3f) & 1) == 0))) {
      sVar26 = sVar26 + 1;
    }
    if (sVar26 == 0) {
      if ((flags >> 10 & 1) != 0) goto LAB_00422f9f;
      CVar11 = CURLUE_NO_HOST;
      goto LAB_00423229;
    }
    CVar8 = Curl_dyn_addn(&host,url,sVar26);
    if (CVar8 != CURLE_OK) goto LAB_00423229;
LAB_00422f9f:
    first = (byte *)(url + sVar26);
    if (pcVar14 == (char *)0x0) {
      bVar4 = false;
    }
    else {
      tmpurl.scheme = (*Curl_cstrdup)(pcVar14);
      bVar4 = true;
      if (tmpurl.scheme == (char *)0x0) goto LAB_00423226;
    }
LAB_00423028:
    CVar11 = CURLUE_OUT_OF_MEMORY;
    pcVar14 = strchr((char *)first,0x23);
    local_158 = u;
    if (pcVar14 == (char *)0x0) {
      sVar12 = 0;
    }
    else {
      sVar12 = strlen(pcVar14);
      if (1 < sVar12) {
        tmpurl.fragment = (char *)Curl_memdup(pcVar14 + 1,sVar12);
        u = local_158;
        if (tmpurl.fragment != (char *)0x0) {
          _Var5 = junkscan(tmpurl.fragment,flags);
          if (!_Var5) goto LAB_0042308b;
          CVar11 = CURLUE_BAD_FRAGMENT;
          u = local_158;
        }
        goto LAB_00423229;
      }
    }
LAB_0042308b:
    pcVar16 = strchr((char *)first,0x3f);
    local_160 = (char)flags;
    if ((pcVar16 != (char *)0x0) && (pcVar14 == (char *)0x0 || pcVar16 < pcVar14)) {
      sVar17 = strlen(pcVar16);
      uVar24 = sVar17 - sVar12;
      sVar12 = strlen((char *)first);
      sVar26 = sVar12 - sVar17;
      if (uVar24 < 2) {
        tmpurl.query = (*Curl_cstrdup)("");
        u = local_158;
        if (tmpurl.query == (char *)0x0) goto LAB_00423229;
        goto LAB_004231ac;
      }
      if (local_160 < '\0') {
        Curl_dyn_init(&enc,8000000);
        CVar9 = urlencode_str(&enc,pcVar16 + 1,uVar24 - 1,true,true);
        u = local_158;
        if (CVar9 == CURLUE_OK) {
          tmpurl.query = Curl_dyn_ptr(&enc);
          goto LAB_0042318e;
        }
      }
      else {
        tmpurl.query = (char *)Curl_memdup(pcVar16 + 1,uVar24);
        u = local_158;
        if (tmpurl.query != (char *)0x0) {
          tmpurl.query[uVar24 - 1] = '\0';
LAB_0042318e:
          _Var5 = junkscan(tmpurl.query,flags);
          if (_Var5) {
            CVar11 = CURLUE_BAD_QUERY;
            u = local_158;
            goto LAB_00423229;
          }
          goto LAB_004231ac;
        }
      }
LAB_00423226:
      CVar11 = CURLUE_OUT_OF_MEMORY;
      goto LAB_00423229;
    }
    sVar17 = strlen((char *)first);
    sVar26 = sVar17 - sVar12;
LAB_004231ac:
    if (sVar26 != 0) {
      if (-1 < local_160) {
        u = local_158;
        if (tmpurl.path == (char *)0x0) {
LAB_004231d2:
          u = local_158;
          first = (byte *)Curl_memdup(first,sVar26 + 1);
          tmpurl.path = (char *)first;
          if (first == (byte *)0x0) goto LAB_00423226;
          pbVar18 = first + sVar26;
LAB_004232b6:
          *pbVar18 = 0;
          tmpurl.path = (char *)first;
        }
        _Var5 = junkscan(tmpurl.path,flags);
        if (_Var5) {
          CVar11 = CURLUE_BAD_PATH;
        }
        else {
          if ((flags & 0x10) != 0) goto LAB_004234f2;
          pcVar14 = (char *)(*Curl_cmalloc)(sVar26 + 1);
          u = local_158;
          if (pcVar14 != (char *)0x0) {
            *pcVar14 = '\0';
            uVar24 = (ulong)*first;
            if (*first != 0) {
              pbVar18 = (byte *)strchr((char *)first,0x3f);
              pcVar19 = pcVar14;
              pcVar16 = pcVar14;
              local_140 = pcVar14;
              do {
                pcVar14 = pcVar19;
                if ((char)uVar24 == '.') {
                  bVar3 = first[1];
                  if (bVar3 != 0x2f) {
                    iVar7 = bVar3 - 0x2e;
                    if (iVar7 == 0) {
                      bVar3 = first[2];
                      if (bVar3 == 0x2f) {
                        first = first + 3;
                        goto LAB_0042344d;
                      }
                      if (bVar3 == 0) goto LAB_004234b7;
                      iVar7 = 0x3f - (uint)bVar3;
                    }
                    else {
                      if ((bVar3 == 0) || (bVar3 == 0x3f)) goto LAB_004234b7;
                      iVar7 = -iVar7;
                    }
                    if (iVar7 != 0) goto LAB_0042342d;
                    goto LAB_004234b7;
                  }
                  first = first + 2;
LAB_0042344d:
                  uVar24 = (ulong)*first;
                  pcVar14 = pcVar19;
                  if (*first == 0) goto LAB_004234ba;
                }
                else {
                  if ((int)uVar24 != 0x2f) {
LAB_0042342d:
                    do {
                      do {
                        *pcVar16 = (char)uVar24;
                        pcVar16 = pcVar16 + 1;
                        uVar24 = (ulong)first[1];
                        first = first + 1;
                      } while (0x3f < uVar24);
                    } while ((0x8000800000000001U >> (uVar24 & 0x3f) & 1) == 0);
                    *pcVar16 = '\0';
                    goto LAB_0042344d;
                  }
                  if (first[1] - 0x2e != 0) {
                    iVar7 = -(first[1] - 0x2e);
LAB_00423374:
                    if (iVar7 != 0) {
                      iVar7 = strncmp("/../",(char *)first,4);
                      if (iVar7 == 0) {
                        first = first + 3;
                        pcVar14 = pcVar16;
                        do {
                          pcVar16 = pcVar14;
                          if (pcVar14 <= local_140) break;
                          pcVar16 = pcVar14 + -1;
                          pcVar19 = pcVar14 + -1;
                          pcVar14 = pcVar16;
                        } while (*pcVar19 != '/');
                        *pcVar16 = '\0';
                        pcVar19 = local_140;
                        goto LAB_0042344d;
                      }
                      iVar7 = strcmp("/..",(char *)first);
                      if ((iVar7 != 0) &&
                         (iVar7 = strncmp("/..?",(char *)first,4), pcVar19 = local_140, iVar7 != 0))
                      goto LAB_0042342d;
                      goto LAB_00423496;
                    }
                    goto LAB_004234ae;
                  }
                  bVar3 = first[2];
                  if (bVar3 != 0x2f) {
                    if (bVar3 != 0) {
                      iVar7 = 0x3f - (uint)bVar3;
                      goto LAB_00423374;
                    }
                    goto LAB_004234ae;
                  }
                  first = first + 2;
                  uVar24 = 0x2f;
                }
                pcVar19 = pcVar14;
              } while (first < pbVar18 || pbVar18 == (byte *)0x0);
              goto LAB_004234bf;
            }
            goto LAB_004234d9;
          }
        }
        goto LAB_00423229;
      }
      Curl_dyn_init(&enc,8000000);
      CVar9 = urlencode_str(&enc,(char *)first,sVar26,true,false);
      u = local_158;
      if (CVar9 != CURLUE_OK) goto LAB_00423226;
      sVar26 = Curl_dyn_len(&enc);
      first = (byte *)Curl_dyn_ptr(&enc);
      tmpurl.path = (char *)first;
      if (sVar26 != 0) {
        if (first == (byte *)0x0) {
          first = (byte *)0x0;
          tmpurl.path = (char *)0x0;
          goto LAB_004231d2;
        }
        pbVar18 = first + sVar26;
        u = local_158;
        goto LAB_004232b6;
      }
    }
LAB_004234f2:
    sVar26 = Curl_dyn_len(&host);
    u = local_158;
    if (sVar26 == 0) {
      if (((flags >> 10 & 1) != 0) && (CVar8 = Curl_dyn_add(&host,""), CVar8 != CURLE_OK))
      goto LAB_00423229;
LAB_0042359f:
      tmpurl.host = Curl_dyn_ptr(&host);
      goto LAB_00423245;
    }
    enc.bufr = (char *)0x0;
    passwdp = (char *)0x0;
    _len = (char *)0x0;
    pcVar14 = Curl_dyn_ptr(&host);
    pcVar16 = strchr(pcVar14,0x40);
    if (pcVar16 == (char *)0x0) {
      pcVar14 = (char *)0x0;
      CVar11 = CURLUE_OK;
LAB_00423643:
      (*Curl_cfree)(pcVar14);
      (*Curl_cfree)(passwdp);
      (*Curl_cfree)(_len);
      tmpurl.options = (char *)0x0;
      tmpurl.user = (char *)0x0;
      tmpurl.password = (char *)0x0;
      if (pcVar16 != (char *)0x0) goto LAB_00423229;
LAB_00423680:
      pcVar14 = Curl_dyn_ptr(&host);
      iVar7 = __isoc99_sscanf(pcVar14,"[%*45[0123456789abcdefABCDEF:.]%c%n",&endbracket,&len);
      if (iVar7 == 1) {
        CVar11 = CURLUE_BAD_IPV6;
        iVar7 = len;
        if (endbracket == '%') {
          iVar10 = __isoc99_sscanf(pcVar14 + len,"%*[^]]%c%n",&endbracket);
          if ((iVar10 == 1) && (endbracket == ']')) {
            iVar7 = iVar7 + len;
            goto LAB_004237bc;
          }
        }
        else if (endbracket == ']') {
LAB_004237bc:
          if (pcVar14 != (char *)0x0) {
            if (pcVar14[iVar7] != '\0') {
              if (pcVar14[iVar7] == ':') {
                pcVar16 = pcVar14 + iVar7;
                goto LAB_004236e8;
              }
              goto LAB_00423229;
            }
          }
          goto LAB_004237e2;
        }
        goto LAB_00423229;
      }
      pcVar16 = strchr(pcVar14,0x3a);
      if (pcVar16 != (char *)0x0) {
LAB_004236e8:
        Curl_dyn_setlen(&host,(long)pcVar16 - (long)pcVar14);
        if (pcVar16[1] == '\0') {
          if (sVar13 == 0) goto LAB_004238b5;
        }
        else {
          if (((9 < (byte)(pcVar16[1] - 0x30U)) ||
              (lVar21 = strtol(pcVar16 + 1,&enc.bufr,10), 0xffff < lVar21)) || (*enc.bufr != '\0'))
          {
LAB_004238b5:
            CVar11 = CURLUE_BAD_PORT_NUMBER;
            goto LAB_00423229;
          }
          curl_msnprintf((char *)&passwdp,7,"%ld",lVar21);
          tmpurl.portnum = lVar21;
          tmpurl.port = (*Curl_cstrdup)((char *)&passwdp);
          if (tmpurl.port == (char *)0x0) goto LAB_0042390c;
        }
      }
LAB_004237e2:
      pcVar14 = Curl_dyn_ptr(&host);
      _Var5 = junkscan(pcVar14,flags);
      CVar11 = CURLUE_BAD_HOSTNAME;
      if (_Var5) goto LAB_00423229;
      pcVar14 = Curl_dyn_ptr(&host);
      enc.allc = 0;
      enc.toobig = 0;
      enc.bufr = (char *)0x0;
      enc.leng = 0;
      bVar6 = false;
      iVar7 = 0;
      while (!bVar6) {
        if ((((byte)(*pcVar14 - 0x3aU) < 0xf6) ||
            (pcVar16 = (char *)strtoul(pcVar14,&passwdp,0), pcVar16 == (char *)0xffffffffffffffff))
           || (((ulong)pcVar16 >> 0x20 != 0 || (passwdp == pcVar14)))) goto LAB_00423a4b;
        (&enc.bufr)[iVar7] = pcVar16;
        bVar6 = true;
        pcVar14 = passwdp;
        if (*passwdp != '\0') {
          if ((*passwdp != '.') || (iVar7 == 3)) goto LAB_00423a4b;
          iVar7 = iVar7 + 1;
          pcVar14 = passwdp + 1;
          bVar6 = false;
        }
      }
      pcVar14 = enc.bufr;
      uVar24 = enc.leng;
      switch(iVar7) {
      case 0:
        uVar20 = (ulong)enc.bufr & 0xff;
        pcVar14 = (char *)((ulong)enc.bufr >> 0x18);
        uVar24 = (ulong)((uint)((ulong)enc.bufr >> 0x10) & 0xff);
        uVar23 = (ulong)((uint)((ulong)enc.bufr >> 8) & 0xff);
        break;
      case 1:
        if (enc.leng < 0x1000000 && enc.bufr < (char *)0x100) {
          uVar24 = enc.leng >> 0x10;
          uVar23 = enc.leng >> 8 & 0xff;
          uVar20 = enc.leng & 0xff;
          break;
        }
LAB_00423a4b:
        pcVar14 = Curl_dyn_ptr(&host);
        if ((*pcVar14 != '[') && (pcVar16 = strchr(pcVar14,0x25), pcVar16 != (char *)0x0)) {
          CVar8 = Curl_urldecode(pcVar14,0,&passwdp,(size_t *)&enc,REJECT_CTRL);
          if (CVar8 == CURLE_OK) {
            Curl_dyn_reset(&host);
            CVar8 = Curl_dyn_addn(&host,passwdp,(size_t)enc.bufr);
            (*Curl_cfree)(passwdp);
            if (CVar8 == CURLE_OK) goto LAB_00423ac7;
            CVar11 = CURLUE_OUT_OF_MEMORY;
          }
          goto LAB_00423229;
        }
LAB_00423ac7:
        pcVar14 = Curl_dyn_ptr(&host);
        sVar13 = Curl_dyn_len(&host);
        CVar11 = hostname_check(&tmpurl,pcVar14,sVar13);
        if (CVar11 != CURLUE_OK) goto LAB_00423229;
        goto LAB_00423b00;
      case 2:
        if (0xffff < enc.allc || (0xff < enc.leng || (char *)0xff < enc.bufr)) goto LAB_00423a4b;
        uVar23 = enc.allc >> 8;
        uVar20 = enc.allc & 0xff;
        break;
      case 3:
        uVar23 = enc.allc;
        uVar20 = enc.toobig;
        if ((0xff < enc.toobig || 0xff < enc.allc) || (0xff < enc.leng || (char *)0xff < enc.bufr))
        goto LAB_00423a4b;
        break;
      default:
        goto switchD_0042392e_default;
      }
      curl_msnprintf(local_88,0x11,"%u.%u.%u.%u",pcVar14,uVar24,uVar23,uVar20);
switchD_0042392e_default:
      Curl_dyn_reset(&host);
      CVar8 = Curl_dyn_add(&host,local_88);
      if (CVar8 == CURLE_OK) {
LAB_00423b00:
        if ((flags >> 9 & 1) != 0 && !bVar4) {
          pcVar14 = Curl_dyn_ptr(&host);
          iVar7 = curl_strnequal(pcVar14,"ftp.",4);
          if (iVar7 == 0) {
            iVar7 = curl_strnequal(pcVar14,"dict.",5);
            if (iVar7 == 0) {
              iVar7 = curl_strnequal(pcVar14,"ldap.",5);
              if (iVar7 == 0) {
                iVar7 = curl_strnequal(pcVar14,"imap.",5);
                if (iVar7 == 0) {
                  iVar7 = curl_strnequal(pcVar14,"smtp.",5);
                  if (iVar7 == 0) {
                    iVar7 = curl_strnequal(pcVar14,"pop3.",5);
                    pcVar14 = "pop3";
                    if (iVar7 == 0) {
                      pcVar14 = "http";
                    }
                  }
                  else {
                    pcVar14 = "smtp";
                  }
                }
                else {
                  pcVar14 = "imap";
                }
              }
              else {
                pcVar14 = "ldap";
              }
            }
            else {
              pcVar14 = "dict";
            }
          }
          else {
            pcVar14 = "ftp";
          }
          tmpurl.scheme = (*Curl_cstrdup)(pcVar14);
          if (tmpurl.scheme == (char *)0x0) goto LAB_00423226;
        }
        goto LAB_0042359f;
      }
    }
    else {
      pcVar19 = pcVar16 + 1;
      local_140 = pcVar19;
      if ((tmpurl.scheme == (char *)0x0) ||
         (pCVar15 = Curl_builtin_scheme(tmpurl.scheme,0xffffffffffffffff),
         pCVar15 == (Curl_handler *)0x0)) {
        optionsp = (char **)0x0;
      }
      else {
        optionsp = (char **)&len;
        if ((pCVar15->flags & 0x400) == 0) {
          optionsp = (char **)0x0;
        }
      }
      CVar8 = Curl_parse_login_details
                        (pcVar14,(size_t)(pcVar19 + ~(ulong)pcVar14),&enc.bufr,&passwdp,optionsp);
      pcVar14 = enc.bufr;
      CVar11 = CURLUE_BAD_LOGIN;
      if (CVar8 != CURLE_OK) goto LAB_00423643;
      if (enc.bufr != (char *)0x0) {
        if ((flags & 0x20) == 0) {
          _Var5 = junkscan(enc.bufr,flags);
          if (!_Var5) {
            tmpurl.user = pcVar14;
            goto LAB_0042361d;
          }
          CVar11 = CURLUE_BAD_USER;
        }
        else {
          CVar11 = CURLUE_USER_NOT_ALLOWED;
        }
        goto LAB_00423643;
      }
LAB_0042361d:
      pcVar19 = passwdp;
      if (passwdp != (char *)0x0) {
        _Var5 = junkscan(passwdp,flags);
        if (_Var5) {
          CVar11 = CURLUE_BAD_PASSWORD;
          goto LAB_00423643;
        }
        tmpurl.password = pcVar19;
      }
      pcVar19 = _len;
      if (_len != (char *)0x0) {
        _Var5 = junkscan(_len,flags);
        if (_Var5) goto LAB_00423643;
        tmpurl.options = pcVar19;
      }
      sVar12 = strlen(local_140);
      CVar8 = Curl_dyn_tail(&host,sVar12);
      if (CVar8 == CURLE_OK) goto LAB_00423680;
    }
LAB_0042390c:
    CVar11 = CURLUE_OUT_OF_MEMORY;
  }
  else {
    CVar11 = CURLUE_MALFORMED_INPUT;
  }
LAB_00423229:
  Curl_dyn_free(&host);
  free_urlhandle(&tmpurl);
  if (CVar11 != CURLUE_OK) {
    return CVar11;
  }
LAB_00423245:
  free_urlhandle(u);
  pCVar22 = &tmpurl;
  for (lVar21 = 0xb; lVar21 != 0; lVar21 = lVar21 + -1) {
    u->scheme = pCVar22->scheme;
    pCVar22 = (CURLU *)((long)pCVar22 + (ulong)bVar27 * -0x10 + 8);
    u = (Curl_URL *)((long)u + (ulong)bVar27 * -0x10 + 8);
  }
  return CURLUE_OK;
  while (pcVar19 = pcVar16 + -1, pcVar1 = pcVar16 + -1, pcVar16 = pcVar19, *pcVar1 != '/') {
LAB_00423496:
    pcVar14 = local_140;
    if (pcVar16 <= local_140) break;
  }
LAB_004234ae:
  *pcVar16 = '/';
  pcVar19 = pcVar16 + 1;
  pcVar16 = pcVar19;
LAB_004234b7:
  *pcVar19 = '\0';
LAB_004234ba:
  if (pbVar18 != (byte *)0x0) {
LAB_004234bf:
    sVar12 = strlen((char *)pbVar18);
    memcpy(pcVar16,pbVar18,sVar12 + 1);
  }
LAB_004234d9:
  (*Curl_cfree)(tmpurl.path);
  tmpurl.path = pcVar14;
  goto LAB_004234f2;
}

Assistant:

static CURLUcode parseurl_and_replace(const char *url, CURLU *u,
                                      unsigned int flags)
{
  CURLUcode result;
  CURLU tmpurl;
  memset(&tmpurl, 0, sizeof(tmpurl));
  result = parseurl(url, &tmpurl, flags);
  if(!result) {
    free_urlhandle(u);
    *u = tmpurl;
  }
  return result;
}